

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_progress_bar.cpp
# Opt level: O0

void __thiscall TestProgressBar::End(TestProgressBar *this)

{
  bool bVar1;
  ExprLhs<bool> EVar2;
  AssertionHandler *in_RDI;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_ffffffffffffff48;
  Flags in_stack_ffffffffffffff4c;
  atomic<bool> *in_stack_ffffffffffffff50;
  AssertionHandler *this_00;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  StringRef in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff78;
  AssertionHandler *in_stack_ffffffffffffff80;
  AssertionHandler local_70;
  
  std::atomic<bool>::operator=(in_stack_ffffffffffffff50,SUB41(in_stack_ffffffffffffff4c >> 0x18,0))
  ;
  std::thread::join();
  bVar1 = TestFailure::IsSet((TestFailure *)0x639946);
  if (bVar1) {
    TestFailure::ThrowError((TestFailure *)0x63995d);
    local_70.m_assertionInfo.lineInfo =
         (SourceLineInfo)
         operator____catch_sr
                   ((char *)in_stack_ffffffffffffff50,
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    this_00 = &local_70;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_progress_bar.cpp"
               ,0x57);
    Catch::StringRef::StringRef
              ((StringRef *)in_RDI,
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    Catch::AssertionHandler::AssertionHandler
              (in_RDI,(StringRef *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
               (SourceLineInfo *)this_00,in_stack_ffffffffffffff68,in_stack_ffffffffffffff4c);
    EVar2 = Catch::Decomposer::operator<=
                      ((Decomposer *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       false);
    Catch::AssertionHandler::handleExpr<bool>
              (in_stack_ffffffffffffff80,
               (ExprLhs<bool> *)CONCAT17(EVar2.m_lhs,in_stack_ffffffffffffff78));
    Catch::AssertionHandler::complete(this_00);
    Catch::AssertionHandler::~AssertionHandler(this_00);
  }
  return;
}

Assistant:

void End() {
		stop = true;
		check_thread.join();
		if (error.IsSet()) {
			error.ThrowError();
			// This should never be reached, ThrowError() should contain a failing REQUIRE statement
			REQUIRE(false);
		}
	}